

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void anon_unknown.dwarf_119be61::SeedStrengthen(CSHA512 *hasher,RNGState *rng,duration dur)

{
  long lVar1;
  ulong uVar2;
  uint64_t *puVar3;
  CSHA512 *pCVar4;
  int iVar5;
  long in_FS_OFFSET;
  ulong local_170;
  uchar strengthen_seed [32];
  uchar buffer [64];
  CSHA512 inner_hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&inner_hasher,hasher,200);
  RNGState::MixExtract(rng,strengthen_seed,0x20,&inner_hasher,false,true);
  CSHA512::CSHA512(&inner_hasher);
  CSHA512::Write(&inner_hasher,strengthen_seed,0x20);
  pCVar4 = (CSHA512 *)std::chrono::_V2::steady_clock::now();
  puVar3 = pCVar4->s;
  iVar5 = 0;
  do {
    for (; iVar5 != 1000; iVar5 = iVar5 + 1) {
      CSHA512::Finalize(&inner_hasher,buffer);
      CSHA512::Reset(&inner_hasher);
      pCVar4 = CSHA512::Write(&inner_hasher,buffer,0x40);
    }
    uVar2 = rdtsc();
    local_170 = uVar2 & 0xffffffff00000000 | CONCAT44((int)((ulong)pCVar4 >> 0x20),(int)uVar2);
    CSHA512::Write(hasher,(uchar *)&local_170,8);
    pCVar4 = (CSHA512 *)std::chrono::_V2::steady_clock::now();
    iVar5 = 0;
  } while ((long)pCVar4 < (long)puVar3 + dur.__r);
  CSHA512::Finalize(&inner_hasher,buffer);
  CSHA512::Write(hasher,buffer,0x40);
  CSHA512::Reset(&inner_hasher);
  memory_cleanse(buffer,0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeedStrengthen(CSHA512& hasher, RNGState& rng, SteadyClock::duration dur) noexcept
{
    // Generate 32 bytes of entropy from the RNG, and a copy of the entropy already in hasher.
    // Never use the deterministic PRNG for this, as the result is only used internally.
    unsigned char strengthen_seed[32];
    rng.MixExtract(strengthen_seed, sizeof(strengthen_seed), CSHA512(hasher), false, /*always_use_real_rng=*/true);
    // Strengthen the seed, and feed it into hasher.
    Strengthen(strengthen_seed, dur, hasher);
}